

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

LogicalType *
duckdb::DecimalSizeCheck(LogicalType *__return_storage_ptr__,LogicalType *left,LogicalType *right)

{
  byte bVar1;
  byte scale;
  bool bVar2;
  byte bVar3;
  InternalException *this;
  LogicalType *type;
  byte local_4b;
  allocator local_4a;
  uint8_t local_49;
  string local_48;
  
  do {
    type = right;
    right = left;
    left = type;
  } while (right->id_ == DECIMAL);
  bVar1 = DecimalType::GetWidth(type);
  scale = DecimalType::GetScale(type);
  bVar2 = LogicalType::GetDecimalProperties(right,&local_4b,&local_49);
  if (bVar2) {
    if ((int)((uint)bVar1 - (uint)scale) < (int)(uint)local_4b) {
      bVar3 = NumericCastImpl<unsigned_char,_int,_false>::Convert((uint)local_4b + (uint)scale);
      bVar1 = 0x26;
      if (bVar3 < 0x26) {
        bVar1 = bVar3;
      }
      LogicalType::DECIMAL(__return_storage_ptr__,bVar1,scale);
    }
    else {
      LogicalType::LogicalType(__return_storage_ptr__,type);
    }
    return __return_storage_ptr__;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_48,"Type provided to DecimalSizeCheck was not a numeric type",
             &local_4a);
  InternalException::InternalException(this,&local_48);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static LogicalType DecimalSizeCheck(const LogicalType &left, const LogicalType &right) {
	D_ASSERT(left.id() == LogicalTypeId::DECIMAL || right.id() == LogicalTypeId::DECIMAL);
	D_ASSERT(left.id() != right.id());

	//! Make sure the 'right' is the DECIMAL type
	if (left.id() == LogicalTypeId::DECIMAL) {
		return DecimalSizeCheck(right, left);
	}
	auto width = DecimalType::GetWidth(right);
	auto scale = DecimalType::GetScale(right);

	uint8_t other_width;
	uint8_t other_scale;
	bool success = left.GetDecimalProperties(other_width, other_scale);
	if (!success) {
		throw InternalException("Type provided to DecimalSizeCheck was not a numeric type");
	}
	D_ASSERT(other_scale == 0);
	const auto effective_width = width - scale;
	if (other_width > effective_width) {
		auto new_width = NumericCast<uint8_t>(other_width + scale);
		//! Cap the width at max, if an actual value exceeds this, an exception will be thrown later
		if (new_width > DecimalType::MaxWidth()) {
			new_width = DecimalType::MaxWidth();
		}
		return LogicalType::DECIMAL(new_width, scale);
	}
	return right;
}